

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O2

menu * menu_new_action(menu_action *acts,size_t n)

{
  menu *m;
  
  m = menu_new(MN_SKIN_SCROLL,&menu_iter_actions);
  m->count = (int)n;
  m->menu_data = acts;
  menu_ensure_cursor_valid(m);
  return m;
}

Assistant:

struct menu *menu_new_action(menu_action *acts, size_t n)
{
	struct menu *m = menu_new(MN_SKIN_SCROLL, menu_find_iter(MN_ITER_ACTIONS));
	menu_setpriv(m, n, acts);
	return m;
}